

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

void __thiscall embree::Geometry::preCommit(Geometry *this)

{
  undefined8 *puVar1;
  allocator local_39;
  string local_38 [32];
  
  if (((this->field_8).field_0x2 & 0x18) != 0) {
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_38,"geometry not committed",&local_39);
  *puVar1 = &PTR__rtcore_error_002496e8;
  *(undefined4 *)(puVar1 + 1) = 3;
  std::__cxx11::string::string((string *)(puVar1 + 2),local_38);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

void Geometry::preCommit()
  {
    if (State::MODIFIED == (State)state)
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"geometry not committed");
  }